

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O0

void predict_or_learn_with_confidence<false,true>
               (confidence *param_1,single_learner *base,example *ec)

{
  example *in_RDX;
  learner<char,_example> *in_RSI;
  float fVar1;
  float opposite_label;
  float existing_label;
  float sensitivity;
  float threshold;
  uint32_t local_28;
  undefined4 uVar2;
  float fVar3;
  
  fVar3 = 0.0;
  uVar2 = 0;
  fVar1 = (in_RDX->l).simple.label;
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    LEARNER::learner<char,_example>::predict(in_RSI,in_RDX,0);
    local_28 = 0x3f800000;
    if (0.0 < (in_RDX->pred).scalar) {
      local_28 = 0xbf800000;
    }
    (in_RDX->l).multi.label = local_28;
  }
  (in_RDX->l).simple.label = fVar1;
  LEARNER::learner<char,_example>::predict(in_RSI,in_RDX,CONCAT44(fVar3,uVar2));
  fVar1 = LEARNER::learner<char,_example>::sensitivity(in_RSI,in_RDX,CONCAT44(fVar3,uVar2));
  in_RDX->confidence = ABS((in_RDX->pred).scalar - fVar3) / fVar1;
  return;
}

Assistant:

void predict_or_learn_with_confidence(confidence& /* c */, single_learner& base, example& ec)
{
  float threshold = 0.f;
  float sensitivity = 0.f;

  float existing_label = ec.l.simple.label;
  if (existing_label == FLT_MAX)
    {
      base.predict(ec);
      float opposite_label = 1.f;
      if (ec.pred.scalar > 0)
        opposite_label = -1.f;
      ec.l.simple.label = opposite_label;
    }

  if (!is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.l.simple.label = existing_label;
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.confidence = fabsf(ec.pred.scalar - threshold) / sensitivity;
}